

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_tests2.cpp
# Opt level: O0

void __thiscall
pkg1::iu_PackageTestFixed_x_iutest_x_B_Test::Body(iu_PackageTestFixed_x_iutest_x_B_Test *this)

{
  bool bVar1;
  TestSuite *this_00;
  char *pcVar2;
  type **in_stack_fffffffffffffdd8;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PackageTestFixed_x_iutest_x_B_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  this_00 = iuutil::GetCurrentTestSuite();
  pcVar2 = iutest::TestSuite::name(this_00);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            ((AssertionResult *)local_38,(internal *)"\"pkg1\" \".\" \"PackageTestFixed\"",
             "::iuutil::GetCurrentTestSuite()->name()","pkg1.PackageTestFixed",pcVar2,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdd8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/package_tests2.cpp"
               ,0x1e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST_F(PackageTestFixed, B)
    {
        IUTEST_EXPECT_PACKAGENAME(pkg1, PackageTestFixed);
    }